

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O1

int coda_ascbin_cursor_get_num_elements(coda_cursor_conflict *cursor,long *num_elements)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  coda_type *pcVar6;
  ulong uVar7;
  int64_t var_dim;
  char s [21];
  long local_50;
  char local_48 [24];
  
  pcVar6 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar6->format) {
    pcVar6 = *(coda_type **)&pcVar6->type_class;
  }
  if (pcVar6->type_class == 1) {
    pcVar4 = *(char **)&pcVar6[1].type_class;
    if (pcVar4 == (char *)0xffffffffffffffff) {
      bVar1 = 0 < *(int *)&pcVar6[1].name;
      lVar5 = 1;
      if (0 < *(int *)&pcVar6[1].name) {
        uVar7 = 0;
        do {
          if ((&pcVar6[1].description)[uVar7] == (char *)0xffffffffffffffff) {
            iVar3 = coda_expression_eval_integer
                              ((coda_expression *)(&pcVar6[2].bit_size)[uVar7],cursor,&local_50);
            if (iVar3 == 0) {
              if (local_50 < 0) {
                coda_str64(local_50,local_48);
                coda_set_error(-300,
                               "product error detected (invalid array size - calculated array size = %s)"
                               ,local_48);
                goto LAB_0014f7fb;
              }
              lVar5 = lVar5 * local_50;
              bVar2 = true;
            }
            else {
              coda_add_error_message(" for dim[%d] expression",uVar7 & 0xffffffff);
LAB_0014f7fb:
              bVar2 = false;
              coda_cursor_add_to_error_message(cursor);
            }
            if (!bVar2) goto LAB_0014f858;
          }
          else {
            lVar5 = lVar5 * (long)(&pcVar6[1].description)[uVar7];
          }
          uVar7 = uVar7 + 1;
          bVar1 = (long)uVar7 < (long)*(int *)&pcVar6[1].name;
        } while ((long)uVar7 < (long)*(int *)&pcVar6[1].name);
      }
      *num_elements = lVar5;
LAB_0014f858:
      if (!bVar1) {
        return 0;
      }
      return -1;
    }
  }
  else {
    if (pcVar6->type_class != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                    ,0x343,"int coda_ascbin_cursor_get_num_elements(const coda_cursor *, long *)");
    }
    pcVar4 = pcVar6[1].name;
  }
  *num_elements = (long)pcVar4;
  return 0;
}

Assistant:

int coda_ascbin_cursor_get_num_elements(const coda_cursor *cursor, long *num_elements)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    switch (type->type_class)
    {
        case coda_record_class:
            *num_elements = ((coda_type_record *)type)->num_fields;
            break;
        case coda_array_class:
            {
                coda_type_array *array = (coda_type_array *)type;

                if (array->num_elements != -1)
                {
                    *num_elements = array->num_elements;
                }
                else
                {
                    long n;
                    int i;

                    /* count the number of elements in array */

                    n = 1;
                    for (i = 0; i < array->num_dims; i++)
                    {
                        if (array->dim[i] == -1)
                        {
                            int64_t var_dim;

                            if (coda_expression_eval_integer(array->dim_expr[i], cursor, &var_dim) != 0)
                            {
                                coda_add_error_message(" for dim[%d] expression", i);
                                coda_cursor_add_to_error_message(cursor);
                                return -1;
                            }
                            if (var_dim < 0)
                            {
                                char s[21];

                                coda_str64(var_dim, s);
                                coda_set_error(CODA_ERROR_PRODUCT, "product error detected (invalid array size - "
                                               "calculated array size = %s)", s);
                                coda_cursor_add_to_error_message(cursor);
                                return -1;
                            }
                            n *= (long)var_dim;
                        }
                        else
                        {
                            n *= array->dim[i];
                        }
                    }
                    *num_elements = n;
                }
            }
            break;
        default:
            assert(0);
            exit(1);
    }

    return 0;
}